

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O2

idx_t __thiscall
duckdb::SortKeyBlobOperator::Encode(SortKeyBlobOperator *this,data_ptr_t result,TYPE input)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  TYPE input_local;
  
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar2 = input.value._0_8_;
  if ((uint)result < 0xd) {
    pcVar2 = input_local.value.pointer.prefix;
  }
  lVar1 = 0;
  for (uVar3 = 0; ((ulong)result & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
    if ((byte)*(SortKeyBlobOperator *)(pcVar2 + uVar3) < 2) {
      this[lVar1] = (SortKeyBlobOperator)0x1;
      this[lVar1 + 1] = *(SortKeyBlobOperator *)(pcVar2 + uVar3);
      lVar1 = lVar1 + 2;
    }
    else {
      this[lVar1] = *(SortKeyBlobOperator *)(pcVar2 + uVar3);
      lVar1 = lVar1 + 1;
    }
  }
  this[lVar1] = (SortKeyBlobOperator)0x0;
  return lVar1 + 1;
}

Assistant:

const char *GetData() const {
		return IsInlined() ? const_char_ptr_cast(value.inlined.inlined) : value.pointer.ptr;
	}